

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reset.cpp
# Opt level: O0

void RequireValueEqual(ConfigurationOption *op,Value *left,Value *right,int line)

{
  StringRef capturedExpression;
  bool bVar1;
  ExprLhs<bool> EVar2;
  StringRef *macroName;
  undefined4 in_ECX;
  undefined8 *in_RDI;
  AssertionHandler catchAssertionHandler;
  string error;
  undefined4 in_stack_fffffffffffffe98;
  Flags in_stack_fffffffffffffe9c;
  Value *in_stack_fffffffffffffea0;
  AssertionHandler *this;
  undefined4 in_stack_fffffffffffffeb0;
  char *pcVar3;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffec8;
  AssertionHandler *in_stack_fffffffffffffed0;
  SourceLineInfo local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  string local_b8 [32];
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  string local_40 [36];
  undefined4 local_1c;
  undefined8 *local_8;
  
  local_1c = in_ECX;
  local_8 = in_RDI;
  bVar1 = ValueEqual(in_stack_fffffffffffffea0,
                     (Value *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (!bVar1) {
    paVar4 = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,"\nLINE[%d] (Option:%s) | Expected left:\'%s\' and right:\'%s\' to be equal"
               ,paVar4);
    pcVar3 = (char *)*local_8;
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::StringUtil::Format<int,char_const*,std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    macroName = (StringRef *)std::operator<<((ostream *)&std::cerr,local_40);
    std::ostream::operator<<(macroName,std::endl<char,std::char_traits<char>>);
    local_110 = (SourceLineInfo)
                operator____catch_sr
                          ((char *)in_stack_fffffffffffffea0,
                           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    this = (AssertionHandler *)&stack0xfffffffffffffee0;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_reset.cpp"
               ,0xbb);
    Catch::StringRef::StringRef
              ((StringRef *)CONCAT44(local_1c,in_stack_fffffffffffffeb0),(char *)macroName);
    capturedExpression.m_size = (size_type)paVar4;
    capturedExpression.m_start = pcVar3;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)CONCAT44(local_1c,in_stack_fffffffffffffeb0),macroName,
               (SourceLineInfo *)this,capturedExpression,in_stack_fffffffffffffe9c);
    EVar2 = Catch::Decomposer::operator<=
                      ((Decomposer *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       false);
    Catch::AssertionHandler::handleExpr<bool>
              (in_stack_fffffffffffffed0,
               (ExprLhs<bool> *)CONCAT17(EVar2.m_lhs,in_stack_fffffffffffffec8));
    Catch::AssertionHandler::complete(this);
    Catch::AssertionHandler::~AssertionHandler(this);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void RequireValueEqual(const ConfigurationOption &op, const Value &left, const Value &right, int line) {
	if (ValueEqual(left, right)) {
		return;
	}
	auto error = StringUtil::Format("\nLINE[%d] (Option:%s) | Expected left:'%s' and right:'%s' to be equal", line,
	                                op.name, left.ToString(), right.ToString());
	cerr << error << endl;
	REQUIRE(false);
}